

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.c
# Opt level: O3

void ma_pcm_s24_to_s32(void *dst,void *src,ma_uint64 count,ma_dither_mode ditherMode)

{
  ma_uint64 mVar1;
  ma_uint8 *src_s24;
  byte *pbVar2;
  
  if (count != 0) {
    pbVar2 = (byte *)((long)src + 2);
    mVar1 = 0;
    do {
      *(uint *)((long)dst + mVar1 * 4) = (uint)*pbVar2 << 0x18 | (uint)*(ushort *)(pbVar2 + -2) << 8
      ;
      mVar1 = mVar1 + 1;
      pbVar2 = pbVar2 + 3;
    } while (count != mVar1);
  }
  return;
}

Assistant:

static MA_INLINE void ma_pcm_s24_to_s32__reference(void* dst, const void* src, ma_uint64 count, ma_dither_mode ditherMode)
{
    ma_int32* dst_s32 = (ma_int32*)dst;
    const ma_uint8* src_s24 = (const ma_uint8*)src;

    ma_uint64 i;
    for (i = 0; i < count; i += 1) {
        dst_s32[i] = (ma_int32)(((ma_uint32)(src_s24[i*3+0]) << 8) | ((ma_uint32)(src_s24[i*3+1]) << 16) | ((ma_uint32)(src_s24[i*3+2])) << 24);
    }

    (void)ditherMode;
}